

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall argstest::PositionalBase::Reset(PositionalBase *this)

{
  (this->super_NamedBase).super_Base.matched = false;
  (this->super_NamedBase).field_0xc1 = 1;
  (this->super_NamedBase).super_Base.error = None;
  (this->super_NamedBase).super_Base.errorMsg._M_string_length = 0;
  *(this->super_NamedBase).super_Base.errorMsg._M_dataplus._M_p = '\0';
  return;
}

Assistant:

virtual void Reset() noexcept override
            {
                matched = false;
                ready = true;
#ifdef ARGS_NOEXCEPT
                error = Error::None;
                errorMsg.clear();
#endif
            }